

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O3

pair<unsigned_long,_unsigned_long> absl::PowFive(uint64_t num,int expfive)

{
  bool bVar1;
  byte bVar2;
  undefined8 in_RCX;
  uint uVar6;
  ulong uVar7;
  pair<unsigned_long,_unsigned_long> pVar8;
  pair<unsigned_long,_unsigned_long> pVar9;
  pair<unsigned_long,_unsigned_long> num_00;
  pair<unsigned_long,_unsigned_long> num_01;
  ulong uVar3;
  unsigned_long uVar4;
  ulong uVar5;
  
  uVar4 = 0;
  pVar8.second = 0;
  pVar8.first = num;
  uVar6 = expfive;
  if (0xc < expfive) {
    do {
      num_00.second = 0x48c27395;
      num_00.first = uVar4;
      pVar8 = Mul32((absl *)num,num_00,(uint32_t)in_RCX);
      uVar4 = pVar8.second;
      num = pVar8.first;
      uVar6 = expfive - 0xd;
      bVar1 = 0x19 < (uint)expfive;
      expfive = uVar6;
    } while (bVar1);
  }
  num_01.second._0_4_ = *(uint32_t *)(&DAT_002820b0 + (ulong)(uVar6 & 0xf) * 4);
  num_01.first = pVar8.second;
  num_01.second._4_4_ = 0;
  pVar9 = Mul32((absl *)pVar8.first,num_01,*(uint32_t *)(&DAT_002820b0 + (ulong)(uVar6 & 0xf) * 4));
  uVar5 = pVar9.second;
  uVar3 = pVar9.first;
  if (uVar3 == 0) {
    uVar7 = 0x40;
  }
  else {
    uVar7 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    uVar7 = uVar7 ^ 0x3f;
  }
  if (uVar7 != 0) {
    bVar2 = (byte)uVar7;
    pVar9.second = uVar5 << (bVar2 & 0x3f);
    pVar9.first = (uVar3 << (bVar2 & 0x3f)) + (uVar5 >> (-bVar2 & 0x3f));
  }
  return pVar9;
}

Assistant:

static std::pair<uint64_t, uint64_t> PowFive(uint64_t num, int expfive) {
  std::pair<uint64_t, uint64_t> result = {num, 0};
  while (expfive >= 13) {
    // 5^13 is the highest power of five that will fit in a 32-bit integer.
    result = Mul32(result, 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5);
    expfive -= 13;
  }
  constexpr int powers_of_five[13] = {
      1,
      5,
      5 * 5,
      5 * 5 * 5,
      5 * 5 * 5 * 5,
      5 * 5 * 5 * 5 * 5,
      5 * 5 * 5 * 5 * 5 * 5,
      5 * 5 * 5 * 5 * 5 * 5 * 5,
      5 * 5 * 5 * 5 * 5 * 5 * 5 * 5,
      5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5,
      5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5,
      5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5,
      5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5};
  result = Mul32(result, powers_of_five[expfive & 15]);
  int shift = strings_internal::CountLeadingZeros64(result.first);
  if (shift != 0) {
    result.first = (result.first << shift) + (result.second >> (64 - shift));
    result.second = (result.second << shift);
  }
  return result;
}